

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O1

bool draco::DecodeSymbols
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  
  if (num_values == 0) {
    return true;
  }
  lVar1 = src_buffer->pos_ + 1;
  if (lVar1 <= src_buffer->data_size_) {
    cVar2 = src_buffer->data_[src_buffer->pos_];
    src_buffer->pos_ = lVar1;
    if (cVar2 == '\x01') {
      bVar3 = DecodeRawSymbols<draco::RAnsSymbolDecoder>(num_values,src_buffer,out_values);
      return bVar3;
    }
    if (cVar2 == '\0') {
      bVar3 = DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
                        (num_values,num_components,src_buffer,out_values);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool DecodeSymbols(uint32_t num_values, int num_components,
                   DecoderBuffer *src_buffer, uint32_t *out_values) {
  if (num_values == 0) {
    return true;
  }
  // Decode which scheme to use.
  uint8_t scheme;
  if (!src_buffer->Decode(&scheme)) {
    return false;
  }
  if (scheme == SYMBOL_CODING_TAGGED) {
    return DecodeTaggedSymbols<RAnsSymbolDecoder>(num_values, num_components,
                                                  src_buffer, out_values);
  } else if (scheme == SYMBOL_CODING_RAW) {
    return DecodeRawSymbols<RAnsSymbolDecoder>(num_values, src_buffer,
                                               out_values);
  }
  return false;
}